

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalMap.cpp
# Opt level: O2

FloatImage * nv::createNormalMap(Image *img,WrapMode wm,Arg heightWeights,NormalMapFilter filter)

{
  int iVar1;
  Kernel2 *this;
  Kernel2 *this_00;
  FloatImage *pFVar2;
  
  if ((img == (Image *)0x0) &&
     (iVar1 = nvAbort("img != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/NormalMap.cpp"
                      ,0x51,
                      "FloatImage *nv::createNormalMap(const Image *, FloatImage::WrapMode, Vector4::Arg, NormalMapFilter)"
                     ), iVar1 == 1)) {
    raise(5);
  }
  switch(filter) {
  case NormalMapFilter_Sobel3x3:
    this = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(this,3);
    break;
  case NormalMapFilter_Sobel5x5:
    this = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(this,5);
    break;
  case NormalMapFilter_Sobel7x7:
    this = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(this,7);
    break;
  case NormalMapFilter_Sobel9x9:
    this = (Kernel2 *)operator_new(0x10);
    Kernel2::Kernel2(this,9);
    break;
  default:
    this = (Kernel2 *)0x0;
  }
  Kernel2::initSobel(this);
  Kernel2::normalize(this);
  this_00 = (Kernel2 *)operator_new(0x10);
  Kernel2::Kernel2(this_00,this);
  Kernel2::transpose(this_00);
  pFVar2 = ::createNormalMap(img,wm,heightWeights,this,this_00);
  return pFVar2;
}

Assistant:

FloatImage * nv::createNormalMap(const Image * img, FloatImage::WrapMode wm, Vector4::Arg heightWeights, NormalMapFilter filter /*= Sobel3x3*/)
{
	nvCheck(img != NULL);
	
	// Init the kernels.
	Kernel2 * kdu = NULL;
	Kernel2 * kdv = NULL;

	switch(filter)
	{
		case NormalMapFilter_Sobel3x3:
			kdu = new Kernel2(3);
			break;
		case NormalMapFilter_Sobel5x5:
			kdu = new Kernel2(5);
			break;
		case NormalMapFilter_Sobel7x7:
			kdu = new Kernel2(7);
			break;
		case NormalMapFilter_Sobel9x9:
			kdu = new Kernel2(9);
			break;
		default:
			nvDebugCheck(false);
	};

	kdu->initSobel();
	kdu->normalize();

	kdv = new Kernel2(*kdu);
	kdv->transpose();

	return ::createNormalMap(img, wm, heightWeights, kdu, kdv);
}